

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

_outconnect * linetraverser_next(t_linetraverser *t)

{
  int iVar1;
  int iVar2;
  t_object *x;
  _outconnect *lastconnect;
  _outconnect *p_Var3;
  int iVar4;
  int iVar5;
  _gobj **pp_Var6;
  t_object *x_00;
  
  lastconnect = t->tr_nextoc;
  do {
    if (lastconnect != (_outconnect *)0x0) {
      p_Var3 = obj_nexttraverseoutlet(lastconnect,&t->tr_ob2,&t->tr_inlet,&t->tr_inno);
      t->tr_nextoc = p_Var3;
      iVar2 = obj_ninlets(t->tr_ob2);
      t->tr_nin = iVar2;
      if (iVar2 == 0) {
        bug("drawline");
      }
      iVar2 = glist_isvisible(t->tr_x);
      if (iVar2 == 0) {
        t->tr_lx1 = 0;
        t->tr_ly1 = 0;
        t->tr_lx2 = 0;
        t->tr_ly2 = 0;
        t->tr_x21 = 0;
        t->tr_y21 = 0;
        t->tr_x22 = 0;
        t->tr_y22 = 0;
      }
      else {
        iVar2 = t->tr_nin + -1;
        if (t->tr_nin == 1) {
          iVar2 = 1;
        }
        iVar5 = t->tr_nout + -1;
        if (t->tr_nout == 1) {
          iVar5 = 1;
        }
        iVar1 = t->tr_x->gl_zoom;
        iVar4 = iVar1 * -7;
        iVar1 = iVar1 * 3;
        gobj_getrect(&t->tr_ob2->te_g,t->tr_x,&t->tr_x21,&t->tr_y21,&t->tr_x22,&t->tr_y22);
        t->tr_lx1 = t->tr_x11 + iVar1 + (((iVar4 - t->tr_x11) + t->tr_x12) * t->tr_outno) / iVar5;
        t->tr_ly1 = t->tr_y12;
        t->tr_lx2 = t->tr_x21 + iVar1 + (((iVar4 - t->tr_x21) + t->tr_x22) * t->tr_inno) / iVar2;
        t->tr_ly2 = t->tr_y21;
      }
      return lastconnect;
    }
    iVar2 = t->tr_nextoutno;
    while (iVar2 == t->tr_nout) {
      x_00 = t->tr_ob;
      if (x_00 != (t_object *)0x0) goto LAB_001343b4;
      pp_Var6 = &t->tr_x->gl_list;
      while( true ) {
        x_00 = (t_object *)*pp_Var6;
        if (x_00 == (t_object *)0x0) {
          return (_outconnect *)0x0;
        }
        x = pd_checkobject((t_pd *)x_00);
        if (x != (t_object *)0x0) break;
LAB_001343b4:
        pp_Var6 = &(x_00->te_g).g_next;
      }
      t->tr_ob = x;
      iVar2 = obj_noutlets(x);
      t->tr_nout = iVar2;
      iVar2 = glist_isvisible(t->tr_x);
      if (iVar2 == 0) {
        t->tr_x11 = 0;
        t->tr_y11 = 0;
        t->tr_x12 = 0;
        t->tr_y12 = 0;
        iVar2 = 0;
      }
      else {
        gobj_getrect((t_gobj *)x_00,t->tr_x,&t->tr_x11,&t->tr_y11,&t->tr_x12,&t->tr_y12);
        iVar2 = 0;
      }
    }
    t->tr_nextoutno = iVar2 + 1;
    lastconnect = obj_starttraverseoutlet(t->tr_ob,&t->tr_outlet,iVar2);
    t->tr_outno = iVar2;
  } while( true );
}

Assistant:

t_outconnect *linetraverser_next(t_linetraverser *t)
{
    t_outconnect *rval = t->tr_nextoc;
    int outno;
    while (!rval)
    {
        outno = t->tr_nextoutno;
        while (outno == t->tr_nout)
        {
            t_gobj *y;
            t_object *ob = 0;
            if (!t->tr_ob) y = t->tr_x->gl_list;
            else y = t->tr_ob->ob_g.g_next;
            for (; y; y = y->g_next)
                if ((ob = pd_checkobject(&y->g_pd))) break;
            if (!ob) return (0);
            t->tr_ob = ob;
            t->tr_nout = obj_noutlets(ob);
            outno = 0;
            if (glist_isvisible(t->tr_x))
                gobj_getrect(y, t->tr_x,
                    &t->tr_x11, &t->tr_y11, &t->tr_x12, &t->tr_y12);
            else t->tr_x11 = t->tr_y11 = t->tr_x12 = t->tr_y12 = 0;
        }
        t->tr_nextoutno = outno + 1;
        rval = obj_starttraverseoutlet(t->tr_ob, &t->tr_outlet, outno);
        t->tr_outno = outno;
    }
    t->tr_nextoc = obj_nexttraverseoutlet(rval, &t->tr_ob2,
        &t->tr_inlet, &t->tr_inno);
    t->tr_nin = obj_ninlets(t->tr_ob2);
    if (!t->tr_nin) bug("drawline");
    if (glist_isvisible(t->tr_x))
    {
        int inplus = (t->tr_nin == 1 ? 1 : t->tr_nin - 1);
        int outplus = (t->tr_nout == 1 ? 1 : t->tr_nout - 1);
        int iow = IOWIDTH * t->tr_x->gl_zoom;
        int iom = IOMIDDLE * t->tr_x->gl_zoom;
        gobj_getrect(&t->tr_ob2->ob_g, t->tr_x,
            &t->tr_x21, &t->tr_y21, &t->tr_x22, &t->tr_y22);
        t->tr_lx1 = t->tr_x11 +
            ((t->tr_x12 - t->tr_x11 - iow) * t->tr_outno) /
                outplus + iom;
        t->tr_ly1 = t->tr_y12;
        t->tr_lx2 = t->tr_x21 +
            ((t->tr_x22 - t->tr_x21 - iow) * t->tr_inno)/inplus +
                iom;
        t->tr_ly2 = t->tr_y21;
    }
    else
    {
        t->tr_x21 = t->tr_y21 = t->tr_x22 = t->tr_y22 = 0;
        t->tr_lx1 = t->tr_ly1 = t->tr_lx2 = t->tr_ly2 = 0;
    }

    return (rval);
}